

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  ManagedType MVar6;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var7;
  cmValue cVar8;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar9;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  cmBTStringRange cVar10;
  string linkProp_3;
  string linkProp;
  size_type __dnew;
  string suffix;
  cmValue imp;
  cmValue loc;
  string local_a8;
  string local_88;
  pointer local_68;
  string local_60;
  cmValue local_40;
  cmValue local_38;
  
  info->NoSOName = false;
  local_38.Value = (string *)0x0;
  local_40.Value = (string *)0x0;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar3 = cmTarget::GetMappedConfig(this->Target,desired_config,&local_38,&local_40,&local_60);
  if (!bVar3) goto LAB_004499be;
  cVar10 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
  _Var7 = cVar10.Begin._M_current;
  if (_Var7._M_current == cVar10.End._M_current._M_current) {
    TVar4 = cmTarget::GetType(this->Target);
    if (TVar4 != INTERFACE_LIBRARY) {
      local_a8._M_dataplus._M_p = (pointer)0x21;
      local_a8._M_string_length = 0x6e963a;
      local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
      local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
      local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
      local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
      views._M_len = 2;
      views._M_array = (iterator)&local_a8;
      cmCatViews_abi_cxx11_(&local_88,views);
      cVar8 = GetProperty(this,&local_88);
      if (cVar8.Value == (string *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_88,0,(char *)local_88._M_string_length,0x6e963a);
        cVar8 = GetProperty(this,&local_88);
        if (cVar8.Value != (string *)0x0) goto LAB_00449142;
      }
      else {
LAB_00449142:
        std::__cxx11::string::_M_assign((string *)&info->LibrariesProp);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   &info->Libraries,cVar8.Value);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&info->LibrariesProp,0,(char *)(info->LibrariesProp)._M_string_length,0x6dc725
              );
    do {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &info->Libraries,_Var7._M_current);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != cVar10.End._M_current._M_current);
  }
  cVar10 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
  _Var7 = cVar10.Begin._M_current;
  if (_Var7._M_current != cVar10.End._M_current._M_current) {
    do {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &info->LibrariesHeadInclude,_Var7._M_current);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != cVar10.End._M_current._M_current);
  }
  cVar10 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
  _Var7 = cVar10.Begin._M_current;
  if (_Var7._M_current != cVar10.End._M_current._M_current) {
    do {
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<BT<std::__cxx11::string>const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 &info->LibrariesHeadExclude,_Var7._M_current);
      _Var7._M_current = _Var7._M_current + 1;
    } while (_Var7._M_current != cVar10.End._M_current._M_current);
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 == INTERFACE_LIBRARY) {
    if (local_38.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&info->LibName);
    }
    goto LAB_004499be;
  }
  if (local_38.Value == (string *)0x0) {
    local_a8._M_dataplus._M_p = &DAT_00000011;
    local_a8._M_string_length = 0x6e3d6a;
    local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
    local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
    local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
    local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_a8;
    cmCatViews_abi_cxx11_(&local_88,views_00);
    cVar8 = GetProperty(this,&local_88);
    if (cVar8.Value == (string *)0x0) {
      local_68 = &DAT_00000011;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_68);
      local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_68,0);
      local_a8.field_2._M_local_buf[7] = (char)((ulong)local_68 >> 0x38);
      *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 8) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 9) = 'L';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 10) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xc) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xd) = 'T';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xe) = 'I';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xf) = 'O';
      local_a8._M_dataplus._M_p[0x10] = 'N';
      local_a8._M_string_length = (size_type)local_68;
      local_a8._M_dataplus._M_p[(long)local_68] = '\0';
      cVar8 = GetProperty(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 local_a8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (cVar8.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&info->Location);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&info->Location);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&info->Location);
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 == SHARED_LIBRARY) {
    local_a8._M_dataplus._M_p = (pointer)0xf;
    local_a8._M_string_length = 0x70cbd1;
    local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
    local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
    local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
    local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
    views_01._M_len = 2;
    views_01._M_array = (iterator)&local_a8;
    cmCatViews_abi_cxx11_(&local_88,views_01);
    cVar8 = GetProperty(this,&local_88);
    if (cVar8.Value == (string *)0x0) {
      local_a8.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
      local_a8.field_2._M_local_buf[7] = 'D';
      local_a8.field_2._8_7_ = 0x454d414e4f535f;
      local_a8._M_string_length = 0xf;
      local_a8.field_2._M_local_buf[0xf] = '\0';
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      cVar8 = GetProperty(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 local_a8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (cVar8.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&info->SOName);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&info->SOName);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 == SHARED_LIBRARY) {
    local_a8._M_dataplus._M_p = (pointer)0x12;
    local_a8._M_string_length = 0x70cbe1;
    local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
    local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
    local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
    local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
    views_02._M_len = 2;
    views_02._M_array = (iterator)&local_a8;
    cmCatViews_abi_cxx11_(&local_88,views_02);
    cVar8 = GetProperty(this,&local_88);
    pcVar9 = extraout_RDX;
    if (cVar8.Value == (string *)0x0) {
      local_68 = (char *)0x12;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      local_a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_68);
      local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_68,0);
      local_a8.field_2._M_local_buf[7] = (char)((ulong)local_68 >> 0x38);
      *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 8) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 9) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 10) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xb) = '_';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xc) = 'S';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xd) = 'O';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xe) = 'N';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0xf) = 'A';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x10) = 'M';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p + 0x11) = 'E';
      local_a8._M_string_length = (size_type)local_68;
      local_a8._M_dataplus._M_p[(long)local_68] = '\0';
      cVar8 = GetProperty(this,&local_a8);
      pcVar9 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 local_a8.field_2._M_allocated_capacity._0_7_) + 1);
        pcVar9 = extraout_RDX_01;
      }
      if (cVar8.Value != (string *)0x0) goto LAB_004494bc;
    }
    else {
LAB_004494bc:
      value._M_str = pcVar9;
      value._M_len = (size_t)((cVar8.Value)->_M_dataplus)._M_p;
      bVar3 = cmValue::IsOn((cmValue *)(cVar8.Value)->_M_string_length,value);
      info->NoSOName = bVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_40.Value == (string *)0x0) {
    TVar4 = cmTarget::GetType(this->Target);
    if ((TVar4 == SHARED_LIBRARY) || (bVar3 = IsExecutableWithExports(this), bVar3)) {
      local_a8._M_dataplus._M_p = (pointer)0xf;
      local_a8._M_string_length = 0x6e97d5;
      local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
      local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
      local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
      local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
      views_03._M_len = 2;
      views_03._M_array = (iterator)&local_a8;
      cmCatViews_abi_cxx11_(&local_88,views_03);
      cVar8 = GetProperty(this,&local_88);
      if (cVar8.Value == (string *)0x0) {
        local_a8.field_2._M_allocated_capacity._0_7_ = 0x4554524f504d49;
        local_a8.field_2._M_local_buf[7] = 'D';
        local_a8.field_2._8_7_ = 0x42494c504d495f;
        local_a8._M_string_length = 0xf;
        local_a8.field_2._M_local_buf[0xf] = '\0';
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        cVar8 = GetProperty(this,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT17(local_a8.field_2._M_local_buf[7],
                                   local_a8.field_2._M_allocated_capacity._0_7_) + 1);
        }
        if (cVar8.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&info->ImportLibrary);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&info->ImportLibrary);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&info->ImportLibrary);
  }
  local_a8._M_dataplus._M_p = (char *)0x21;
  local_a8._M_string_length = 0x70cc16;
  local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
  local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
  local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
  local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
  views_04._M_len = 2;
  views_04._M_array = (iterator)&local_a8;
  cmCatViews_abi_cxx11_(&local_88,views_04);
  cVar8 = GetProperty(this,&local_88);
  paVar1 = &local_a8.field_2;
  if (cVar8.Value == (string *)0x0) {
    local_68 = (char *)0x21;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    local_a8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_68);
    local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_68,0);
    local_a8.field_2._M_local_buf[7] = (char)((ulong)local_68 >> 0x38);
    builtin_strncpy(local_a8._M_dataplus._M_p,"IMPORTED_LINK_DEPENDENT_LIBRARIES",0x21);
    local_a8._M_string_length = (size_type)local_68;
    local_a8._M_dataplus._M_p[(long)local_68] = '\0';
    cVar8 = GetProperty(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT17(local_a8.field_2._M_local_buf[7],
                               local_a8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (cVar8.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&info->SharedDeps);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&info->SharedDeps);
  }
  paVar2 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 == STATIC_LIBRARY) {
    local_a8._M_dataplus._M_p = (char *)0x21;
    local_a8._M_string_length = 0x70cbf4;
    local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
    local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
    local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
    local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
    views_05._M_len = 2;
    views_05._M_array = (iterator)&local_a8;
    cmCatViews_abi_cxx11_(&local_88,views_05);
    cVar8 = GetProperty(this,&local_88);
    if (cVar8.Value == (string *)0x0) {
      local_68 = (char *)0x21;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      local_a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_68);
      local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_68,0);
      local_a8.field_2._M_local_buf[7] = (char)((ulong)local_68 >> 0x38);
      builtin_strncpy(local_a8._M_dataplus._M_p,"IMPORTED_LINK_INTERFACE_LANGUAGES",0x21);
      local_a8._M_string_length = (size_type)local_68;
      local_a8._M_dataplus._M_p[(long)local_68] = '\0';
      cVar8 = GetProperty(this,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,
                        CONCAT17(local_a8.field_2._M_local_buf[7],
                                 local_a8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (cVar8.Value != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)&info->Languages);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&info->Languages);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  local_88._M_dataplus._M_p = (char *)0x20;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_a8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_88);
  local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_88._M_dataplus._M_p,0);
  local_a8.field_2._M_local_buf[7] = (char)((ulong)local_88._M_dataplus._M_p >> 0x38);
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x10) = 'L';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x11) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x12) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x13) = 'G';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x14) = 'U';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x15) = 'A';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x16) = 'G';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x17) = 'E';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x18) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x19) = 'R';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1a) = 'U';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1b) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1c) = 'T';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1d) = 'I';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1e) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0x1f) = 'E';
  *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 8) = '_';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 9) = 'C';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 10) = 'O';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xb) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xc) = 'M';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xd) = 'O';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xe) = 'N';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p + 0xf) = '_';
  local_a8._M_string_length = (size_type)local_88._M_dataplus._M_p;
  local_a8._M_dataplus._M_p[(long)local_88._M_dataplus._M_p] = '\0';
  std::operator+(&local_88,&local_a8,&local_60);
  cVar8 = GetProperty(this,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((cVar8.Value != (string *)0x0) ||
     (cVar8 = GetProperty(this,&local_a8), cVar8.Value != (string *)0x0)) {
    if ((cVar8.Value)->_M_string_length == 0) {
      MVar6 = Mixed;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)cVar8.Value);
      MVar6 = Managed - (iVar5 == 0);
    }
    info->Managed = MVar6;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT17(local_a8.field_2._M_local_buf[7],
                             local_a8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  TVar4 = cmTarget::GetType(this->Target);
  if (TVar4 != STATIC_LIBRARY) goto LAB_004499be;
  local_a8._M_dataplus._M_p = (pointer)0x24;
  local_a8._M_string_length = 0x70cc38;
  local_a8.field_2._M_allocated_capacity._0_7_ = (undefined7)local_60._M_string_length;
  local_a8.field_2._M_local_buf[7] = (char)(local_60._M_string_length >> 0x38);
  local_a8.field_2._8_7_ = SUB87(local_60._M_dataplus._M_p,0);
  local_a8.field_2._M_local_buf[0xf] = (char)((ulong)local_60._M_dataplus._M_p >> 0x38);
  views_06._M_len = 2;
  views_06._M_array = (iterator)&local_a8;
  cmCatViews_abi_cxx11_(&local_88,views_06);
  cVar8 = GetProperty(this,&local_88);
  if (cVar8.Value == (string *)0x0) {
    local_68 = (char *)0x24;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    local_a8._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_68);
    local_a8.field_2._M_allocated_capacity._0_7_ = SUB87(local_68,0);
    local_a8.field_2._M_local_buf[7] = (char)((ulong)local_68 >> 0x38);
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x10) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x11) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x12) = 'R';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x13) = 'F';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x14) = 'A';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x15) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x16) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x17) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x18) = 'M';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x19) = 'U';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x1a) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x1b) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x1c) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x1d) = 'P';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x1e) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x1f) = 'I';
    *(undefined8 *)local_a8._M_dataplus._M_p = 0x444554524f504d49;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 8) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 9) = 'L';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 10) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xb) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xc) = 'K';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xd) = '_';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xe) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0xf) = 'N';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x20) = 'C';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x21) = 'I';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x22) = 'T';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p + 0x23) = 'Y';
    local_a8._M_string_length = (size_type)local_68;
    local_a8._M_dataplus._M_p[(long)local_68] = '\0';
    cVar8 = GetProperty(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT17(local_a8.field_2._M_local_buf[7],
                               local_a8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (cVar8.Value != (string *)0x0) goto LAB_0044998f;
  }
  else {
LAB_0044998f:
    __isoc99_sscanf(((cVar8.Value)->_M_dataplus)._M_p,"%u",&info->Multiplicity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
LAB_004499be:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                          ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, loc, imp, suffix)) {
    return;
  }

  // Get the link interface.
  {
    // Use the INTERFACE_LINK_LIBRARIES special representation directly
    // to get backtraces.
    cmBTStringRange entries = this->Target->GetLinkInterfaceEntries();
    if (!entries.empty()) {
      info.LibrariesProp = "INTERFACE_LINK_LIBRARIES";
      for (BT<std::string> const& entry : entries) {
        info.Libraries.emplace_back(entry);
      }
    } else if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      std::string linkProp =
        cmStrCat("IMPORTED_LINK_INTERFACE_LIBRARIES", suffix);
      cmValue propertyLibs = this->GetProperty(linkProp);
      if (!propertyLibs) {
        linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        propertyLibs = this->GetProperty(linkProp);
      }
      if (propertyLibs) {
        info.LibrariesProp = linkProp;
        info.Libraries.emplace_back(*propertyLibs);
      }
    }
  }
  for (BT<std::string> const& entry :
       this->Target->GetLinkInterfaceDirectEntries()) {
    info.LibrariesHeadInclude.emplace_back(entry);
  }
  for (BT<std::string> const& entry :
       this->Target->GetLinkInterfaceDirectExcludeEntries()) {
    info.LibrariesHeadExclude.emplace_back(entry);
  }
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    if (loc) {
      info.LibName = *loc;
    }
    return;
  }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if (loc) {
    info.Location = *loc;
  } else {
    std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
    if (cmValue config_location = this->GetProperty(impProp)) {
      info.Location = *config_location;
    } else if (cmValue location = this->GetProperty("IMPORTED_LOCATION")) {
      info.Location = *location;
    }
  }

  // Get the soname.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = cmStrCat("IMPORTED_SONAME", suffix);
    if (cmValue config_soname = this->GetProperty(soProp)) {
      info.SOName = *config_soname;
    } else if (cmValue soname = this->GetProperty("IMPORTED_SONAME")) {
      info.SOName = *soname;
    }
  }

  // Get the "no-soname" mark.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = cmStrCat("IMPORTED_NO_SONAME", suffix);
    if (cmValue config_no_soname = this->GetProperty(soProp)) {
      info.NoSOName = cmIsOn(*config_no_soname);
    } else if (cmValue no_soname = this->GetProperty("IMPORTED_NO_SONAME")) {
      info.NoSOName = cmIsOn(*no_soname);
    }
  }

  // Get the import library.
  if (imp) {
    info.ImportLibrary = *imp;
  } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->IsExecutableWithExports()) {
    std::string impProp = cmStrCat("IMPORTED_IMPLIB", suffix);
    if (cmValue config_implib = this->GetProperty(impProp)) {
      info.ImportLibrary = *config_implib;
    } else if (cmValue implib = this->GetProperty("IMPORTED_IMPLIB")) {
      info.ImportLibrary = *implib;
    }
  }

  // Get the link dependencies.
  {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_DEPENDENT_LIBRARIES", suffix);
    if (cmValue config_libs = this->GetProperty(linkProp)) {
      info.SharedDeps = *config_libs;
    } else if (cmValue libs =
                 this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES")) {
      info.SharedDeps = *libs;
    }
  }

  // Get the link languages.
  if (this->LinkLanguagePropagatesToDependents()) {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_INTERFACE_LANGUAGES", suffix);
    if (cmValue config_libs = this->GetProperty(linkProp)) {
      info.Languages = *config_libs;
    } else if (cmValue libs =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES")) {
      info.Languages = *libs;
    }
  }

  // Get information if target is managed assembly.
  {
    std::string linkProp = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    if (cmValue pc = this->GetProperty(linkProp + suffix)) {
      info.Managed = this->CheckManagedType(*pc);
    } else if (cmValue p = this->GetProperty(linkProp)) {
      info.Managed = this->CheckManagedType(*p);
    }
  }

  // Get the cyclic repetition count.
  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    std::string linkProp =
      cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
    if (cmValue config_reps = this->GetProperty(linkProp)) {
      sscanf(config_reps->c_str(), "%u", &info.Multiplicity);
    } else if (cmValue reps =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps->c_str(), "%u", &info.Multiplicity);
    }
  }
}